

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strex.cc
# Opt level: O3

int ASN1_STRING_print(BIO *bp,ASN1_STRING *v)

{
  uchar uVar1;
  uchar *puVar2;
  bool bVar3;
  int iVar4;
  uchar uVar5;
  int len;
  int len_00;
  long lVar6;
  char buf [80];
  uchar local_88 [88];
  
  if (v == (ASN1_STRING *)0x0) {
    return 0;
  }
  iVar4 = v->length;
  if (0 < iVar4) {
    puVar2 = v->data;
    lVar6 = 0;
    len = 0;
    do {
      uVar1 = puVar2[lVar6];
      uVar5 = '.';
      if ((uVar1 != '\x7f') && (uVar5 = uVar1, (char)uVar1 < ' ')) {
        uVar5 = '.';
        if (uVar1 == '\n') {
          uVar5 = '\n';
        }
        if (uVar1 == '\r') {
          uVar5 = '\r';
        }
      }
      local_88[len] = uVar5;
      len_00 = len + 1;
      bVar3 = 0x4e < len;
      len = len_00;
      if (bVar3) {
        iVar4 = BIO_write(bp,local_88,len_00);
        if (iVar4 < 1) {
          return 0;
        }
        iVar4 = v->length;
        len = 0;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar4);
    if ((0 < len) && (iVar4 = BIO_write(bp,local_88,len), iVar4 < 1)) {
      return 0;
    }
  }
  return 1;
}

Assistant:

int ASN1_STRING_print(BIO *bp, const ASN1_STRING *v) {
  int i, n;
  char buf[80];
  const char *p;

  if (v == NULL) {
    return 0;
  }
  n = 0;
  p = (const char *)v->data;
  for (i = 0; i < v->length; i++) {
    if ((p[i] > '~') || ((p[i] < ' ') && (p[i] != '\n') && (p[i] != '\r'))) {
      buf[n] = '.';
    } else {
      buf[n] = p[i];
    }
    n++;
    if (n >= 80) {
      if (BIO_write(bp, buf, n) <= 0) {
        return 0;
      }
      n = 0;
    }
  }
  if (n > 0) {
    if (BIO_write(bp, buf, n) <= 0) {
      return 0;
    }
  }
  return 1;
}